

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

Own<kj::_::ExclusiveJoinPromiseNode,_kj::_::PromiseDisposer> __thiscall
kj::_::PromiseDisposer::
appendPromise<kj::_::ExclusiveJoinPromiseNode,kj::_::PromiseDisposer,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::SourceLocation&>
          (PromiseDisposer *this,OwnPromiseNode *next,
          Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *params,SourceLocation *params_1)

{
  PromiseArenaMember *pPVar1;
  PromiseArena *pPVar2;
  OwnPromiseNode OVar3;
  OwnPromiseNode local_30;
  OwnPromiseNode local_28;
  
  pPVar1 = &next->ptr->super_PromiseArenaMember;
  pPVar2 = pPVar1->arena;
  if (pPVar2 == (PromiseArena *)0x0 || (ulong)((long)pPVar1 - (long)pPVar2) < 0xb8) {
    alloc<kj::_::ExclusiveJoinPromiseNode,kj::_::PromiseDisposer,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::SourceLocation&>
              (this,next,params,params_1);
  }
  else {
    pPVar1->arena = (PromiseArena *)0x0;
    next->ptr = (PromiseNode *)0x0;
    local_30.ptr = params->ptr;
    params->ptr = (PromiseNode *)0x0;
    local_28.ptr = (PromiseNode *)pPVar1;
    ExclusiveJoinPromiseNode::ExclusiveJoinPromiseNode
              ((ExclusiveJoinPromiseNode *)&pPVar1[-0xc].arena,&local_28,&local_30,*params_1);
    OVar3.ptr = local_30.ptr;
    if (&(local_30.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
      local_30.ptr = (PromiseNode *)0x0;
      dispose(&(OVar3.ptr)->super_PromiseArenaMember);
    }
    OVar3.ptr = local_28.ptr;
    if (&(local_28.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
      local_28.ptr = (PromiseNode *)0x0;
      dispose(&(OVar3.ptr)->super_PromiseArenaMember);
    }
    ((PromiseArenaMember *)&pPVar1[-0xb]._vptr_PromiseArenaMember)->_vptr_PromiseArenaMember =
         (_func_int **)pPVar2;
    *(PromiseArena ***)this = &pPVar1[-0xc].arena;
  }
  return (Own<kj::_::ExclusiveJoinPromiseNode,_kj::_::PromiseDisposer>)
         (ExclusiveJoinPromiseNode *)this;
}

Assistant:

static kj::Own<T, D> appendPromise(
      OwnPromiseNode&& next, Params&&... params) noexcept {
    // Append a promise to the arena that currently ends with `next`. `next` is also still passed as
    // the first parameter to the new object's constructor.
    //
    // This is semantically the same as `allocPromise()` except that it may avoid the underlying
    // memory allocation. `next` must end up being destroyed before the new object (i.e. the new
    // object must never transfer away ownership of `next`).


    PromiseArena* arena = next->arena;

    if (!canArenaAllocate<T>() || arena == nullptr ||
        reinterpret_cast<byte*>(next.get()) - reinterpret_cast<byte*>(arena) < sizeof(T)) {
      // No arena available, or not enough space, or weird alignment needed. Start new arena.
      return alloc<T, D>(kj::mv(next), kj::fwd<Params>(params)...);
    } else {
      // Append to arena.
      //
      // NOTE: When we call ctor(), it takes ownership of `next`, so we shouldn't assume `next`
      //   still exists after it returns. So we have to remove ownership of the arena before that.
      //   In theory if we wanted this to be exception-safe, we'd also have to arrange to delete
      //   the arena if the constructor throws. However, in practice none of the PromiseNode
      //   constructors throw, so we just mark the whole method noexcept in order to avoid the
      //   code bloat to handle this case.
      next->arena = nullptr;
      T* ptr = reinterpret_cast<T*>(next.get()) - 1;
      ctor(*ptr, kj::mv(next), kj::fwd<Params>(params)...);
      ptr->arena = arena;
      KJ_IREQUIRE(reinterpret_cast<void*>(ptr) ==
                  reinterpret_cast<void*>(static_cast<PromiseArenaMember*>(ptr)),
          "PromiseArenaMember must be the leftmost inherited type.");
      return kj::Own<T, D>(ptr);
    }
  }